

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int mapEnd(EndNoise *en,int *out,int x,int z,int w,int h)

{
  int w_00;
  int h_00;
  int *out_00;
  int x_00;
  ulong uVar1;
  ulong uVar2;
  int z_00;
  
  x_00 = x >> 2;
  z_00 = z >> 2;
  w_00 = ((w + x >> 2) - x_00) + 1;
  h_00 = ((h + z >> 2) - z_00) + 1;
  out_00 = (int *)malloc((long)w_00 * (long)h_00 * 4);
  mapEndBiome(en,out_00,x_00,z_00,w_00,h_00);
  if (0 < h) {
    uVar1 = 0;
    do {
      if (0 < w) {
        uVar2 = 0;
        do {
          out[uVar2] = out_00[(long)((z + (int)uVar1 >> 2) - z_00) * (long)w_00 +
                              (long)((x + (int)uVar2 >> 2) - x_00)];
          uVar2 = uVar2 + 1;
        } while ((uint)w != uVar2);
      }
      uVar1 = uVar1 + 1;
      out = out + (uint)w;
    } while (uVar1 != (uint)h);
  }
  free(out_00);
  return 0;
}

Assistant:

int mapEnd(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int cx = x >> 2;
    int cz = z >> 2;
    int64_t cw = ((x+w) >> 2) + 1 - cx;
    int64_t ch = ((z+h) >> 2) + 1 - cz;

    int *buf = (int*) malloc(sizeof(int) * cw * ch);
    mapEndBiome(en, buf, cx, cz, cw, ch);

    int i, j;

    for (j = 0; j < h; j++)
    {
        int cj = ((z+j) >> 2) - cz;
        for (i = 0; i < w; i++)
        {
            int ci = ((x+i) >> 2) - cx;
            int v = buf[cj*cw+ci];
            out[j*w+i] = v;
        }
    }

    free(buf);
    return 0;
}